

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<Qt::DayOfWeek>>
          (QtPrivate *this,QDebug debug,char *which,QList<Qt::DayOfWeek> *c)

{
  long lVar1;
  long lVar2;
  _func_int **pp_Var3;
  QDebug *pQVar4;
  DayOfWeek *pDVar5;
  QDebug dbg;
  DayOfWeek *pDVar6;
  long in_FS_OFFSET;
  QDebug local_60;
  undefined1 local_58 [8];
  QDebug local_50;
  undefined1 local_48 [8];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(((debug.stream)->ts)._vptr_QTextStream + 6) = 0;
  pQVar4 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar4,'(');
  pDVar6 = (c->d).ptr;
  lVar2 = (c->d).size;
  pDVar5 = pDVar6 + lVar2;
  if (lVar2 == 0) goto LAB_002e6fbb;
  local_50.stream = (Stream *)((debug.stream)->ts)._vptr_QTextStream;
  pQVar4 = &local_50;
  (local_50.stream)->ref = (local_50.stream)->ref + 1;
  dbg.stream = (Stream *)local_48;
  ::operator<<(dbg,(DayOfWeek)pQVar4);
  while( true ) {
    QDebug::~QDebug((QDebug *)dbg.stream);
    QDebug::~QDebug(pQVar4);
    pDVar6 = pDVar6 + 1;
LAB_002e6fbb:
    if (pDVar6 == pDVar5) break;
    pQVar4 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60.stream = pQVar4->stream;
    pQVar4 = &local_60;
    (local_60.stream)->ref = (local_60.stream)->ref + 1;
    dbg.stream = (Stream *)local_58;
    ::operator<<(dbg,(DayOfWeek)pQVar4);
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  pp_Var3 = ((debug.stream)->ts)._vptr_QTextStream;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)0x0;
  *(_func_int ***)this = pp_Var3;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}